

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::closePopup(QApplicationPrivate *this,QWidget *popup)

{
  Data *pDVar1;
  QWidgetData *pQVar2;
  char cVar3;
  bool bVar4;
  QWindow *pQVar5;
  QObject *object;
  QWidgetWindow *pQVar6;
  QWidget *pQVar7;
  undefined8 uVar8;
  QDebug *pQVar9;
  QWidget *pQVar10;
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  QDebug local_70;
  Stream *local_68;
  undefined1 local_60 [8];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QWidget::windowHandle(popup);
  if (pQVar5 != (QWindow *)0x0) {
    cVar3 = QGuiApplicationPrivate::closePopup(pQVar5);
    if (cVar3 != '\0') {
      object = (QObject *)QGuiApplicationPrivate::activePopupWindow();
      if (object == (QObject *)0x0) {
        if (popupGrabOk == true) {
          popupGrabOk = false;
          if (active_window != (QWidget *)0x0) {
            pQVar5 = QWidget::windowHandle(active_window);
            if (pQVar5 != (QWindow *)0x0) {
              pQVar2 = popup->data;
              uVar8 = QGuiApplicationPrivate::QLastCursorPosition::toPoint();
              local_58 = (undefined4)uVar8;
              uStack_54 = (undefined4)((ulong)uVar8 >> 0x20);
              cVar3 = QRect::contains((QPoint *)&pQVar2->crect,SUB81(&local_58,0));
              if (cVar3 == '\0') {
                bVar4 = QWidget::testAttribute_helper(popup,WA_NoMouseReplay);
                if (!bVar4) {
                  replayMousePress = true;
                }
              }
            }
          }
          lcWidgetPopup();
          if (((byte)lcWidgetPopup::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_58._0_1_ = (QPaintDevice)0x2;
            local_58._1_3_ = 0;
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_4c = 0;
            uStack_48 = 0;
            uStack_44 = 0;
            local_40 = lcWidgetPopup::category.name;
            QMessageLogger::debug();
            pQVar9 = QDebug::operator<<(&local_70,"ungrab mouse for");
            local_68 = pQVar9->stream;
            *(int *)(local_68 + 0x28) = *(int *)(local_68 + 0x28) + 1;
            ::operator<<((Stream *)local_60,(QWidget *)&local_68);
            QDebug::~QDebug((QDebug *)local_60);
            QDebug::~QDebug((QDebug *)&local_68);
            QDebug::~QDebug(&local_70);
          }
          pQVar10 = QWidget::mouseGrabber();
          pQVar7 = popup;
          if (pQVar10 != (QWidget *)0x0) {
            pQVar7 = QWidget::mouseGrabber();
          }
          this_00 = qt_widget_private(pQVar7);
          QWidgetPrivate::stealMouseGrab(this_00,pQVar10 != (QWidget *)0x0);
          ungrabKeyboardForPopup(popup);
        }
        if (active_window != (QWidget *)0x0) {
          pQVar7 = QWidget::focusWidget(active_window);
          if (pQVar7 != (QWidget *)0x0) {
            if (pQVar7 == focus_widget) {
              uStack_48 = 0xaaaaaaaa;
              uStack_44 = 0xaaaaaaaa;
              local_58._0_1_ = (QPaintDevice)0xaa;
              local_58._1_3_ = 0xaaaaaa;
              uStack_54 = 0xaaaaaaaa;
              uStack_50 = 0xaaaaaaaa;
              uStack_4c = 0xaaaaaaaa;
              QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusIn,PopupFocusReason);
              QCoreApplication::sendEvent(&pQVar7->super_QObject,(QEvent *)&local_58);
              QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
            }
            else {
              QWidget::setFocus(pQVar7,PopupFocusReason);
            }
          }
        }
      }
      else {
        pQVar6 = QtPrivate::qobject_cast_helper<QWidgetWindow_const*,QObject_const>(object);
        if (pQVar6 != (QWidgetWindow *)0x0) {
          pQVar7 = QWidget::focusWidget((QWidget *)(pQVar6->m_widget).wp.value);
          if (pQVar7 != (QWidget *)0x0) {
            QWidget::setFocus(pQVar7,PopupFocusReason);
          }
          if (_operator>> == 1) {
            pDVar1 = (pQVar6->m_widget).wp.d;
            if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
              pQVar7 = (QWidget *)0x0;
            }
            else {
              pQVar7 = (QWidget *)(pQVar6->m_widget).wp.value;
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              grabForPopup(pQVar7);
              return;
            }
            goto LAB_002c0d3a;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_002c0d3a:
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::closePopup(QWidget *popup)
{
    QWindow *win = popup->windowHandle();
    if (!win)
        return;
    if (!QGuiApplicationPrivate::closePopup(win))
        return;

    const QWindow *nextRemainingPopup = QGuiApplicationPrivate::activePopupWindow();
    if (!nextRemainingPopup) { // this was the last popup

        if (popupGrabOk) {
            popupGrabOk = false;

            if (active_window && active_window->windowHandle()
                && !popup->geometry().contains(QGuiApplicationPrivate::lastCursorPosition.toPoint())
                && !popup->testAttribute(Qt::WA_NoMouseReplay)) {
                QApplicationPrivate::replayMousePress = true;
            }

            // transfer grab back to mouse grabber if any, otherwise release the grab
            ungrabMouseForPopup(popup);

            // transfer grab back to keyboard grabber if any, otherwise release the grab
            ungrabKeyboardForPopup(popup);
        }

        if (active_window) {
            if (QWidget *fw = active_window->focusWidget()) {
                if (fw != QApplication::focusWidget()) {
                    fw->setFocus(Qt::PopupFocusReason);
                } else {
                    QFocusEvent e(QEvent::FocusIn, Qt::PopupFocusReason);
                    QCoreApplication::sendEvent(fw, &e);
                }
            }
        }

    } else if (const auto *popupWin = qobject_cast<const QWidgetWindow *>(nextRemainingPopup)) {
        // A popup was closed, so the previous popup gets the focus.
        if (QWidget *fw = popupWin->widget()->focusWidget())
            fw->setFocus(Qt::PopupFocusReason);

        // can become nullptr due to setFocus() above
        if (QGuiApplicationPrivate::popupCount() == 1) // grab mouse/keyboard
            grabForPopup(popupWin->widget());
    }

}